

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImageAspect
          (CopiesAndBlittingTestInstance *this,VkImage image,PixelBufferAccess *dst,
          ImageParms *imageParms)

{
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  TextureFormat *size;
  int iVar1;
  int iVar2;
  int iVar3;
  ChannelOrder order;
  undefined8 uVar4;
  TextureFormat *format;
  Handle<(vk::HandleType)8> HVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  VkAllocationCallbacks *pVVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  VkImageType VVar12;
  VkResult VVar13;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *pAVar14;
  TextureFormat TVar15;
  ulong __n;
  deUint32 queueFamilyIndex;
  VkBuffer local_1d8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1d0;
  TextureFormat *local_1b0;
  Move<vk::Handle<(vk::HandleType)8>_> local_1a8;
  deUint64 local_188;
  undefined8 local_180;
  ulong local_178;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier imageBarrier;
  undefined8 local_b8;
  TextureFormat local_b0;
  int local_a8;
  undefined8 local_a4;
  deUint32 local_9c;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_8c;
  VkImageType local_84;
  ConstPixelBufferAccess local_80;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  pAVar14 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  DStack_1d0.m_device = (VkDevice)0x0;
  DStack_1d0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_1d8.m_internal = 0;
  DStack_1d0.m_deviceIface = (DeviceInterface *)0x0;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar3 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  local_1b0 = (TextureFormat *)dst;
  iVar11 = tcu::getPixelSize((dst->super_ConstPixelBufferAccess).m_format);
  imageBarrier.oldLayout = iVar3 * iVar11 * iVar2 * iVar1;
  __n = (ulong)imageBarrier.oldLayout;
  VVar12 = imageParms->imageType;
  if (VVar12 != VK_IMAGE_TYPE_2D) {
    VVar12 = (imageParms->extent).depth;
  }
  uVar4._0_4_ = (imageParms->extent).width;
  uVar4._4_4_ = (imageParms->extent).height;
  imageBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier._16_8_ = (ulong)imageBarrier.dstAccessMask << 0x20;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.srcQueueFamilyIndex = 2;
  imageBarrier.dstQueueFamilyIndex = 0;
  imageBarrier.image.m_internal._0_4_ = 1;
  imageBarrier.subresourceRange._0_8_ = &queueFamilyIndex;
  ::vk::createBuffer(&local_1a8,vk,device,(VkBufferCreateInfo *)&imageBarrier,
                     (VkAllocationCallbacks *)0x0);
  pVVar8 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar7 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar6 = local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  postImageBarrier._16_8_ =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  postImageBarrier._24_8_ =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  postImageBarrier._0_8_ =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  postImageBarrier.pNext =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1d8.m_internal == 0) {
    DStack_1d0.m_device = pVVar7;
    DStack_1d0.m_allocator = pVVar8;
    local_1d8.m_internal = HVar5.m_internal;
    DStack_1d0.m_deviceIface = pDVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1d0,local_1d8);
    local_1d8.m_internal = postImageBarrier._0_8_;
    DStack_1d0.m_deviceIface = (DeviceInterface *)postImageBarrier.pNext;
    DStack_1d0.m_device = (VkDevice)postImageBarrier._16_8_;
    DStack_1d0.m_allocator = (VkAllocationCallbacks *)postImageBarrier._24_8_;
    if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)&postImageBarrier,vk,device,local_1d8);
  (*pAVar14->_vptr_Allocator[3])(&local_1a8,pAVar14,&postImageBarrier,1);
  HVar5.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  VVar13 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,local_1d8.m_internal,
                      *(long *)(local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                object.m_internal + 8),
                      *(long *)(local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                object.m_internal + 0x10));
  ::vk::checkResult(VVar13,
                    "vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x22f);
  memset(*(void **)(HVar5.m_internal + 0x18),0,__n);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(HVar5.m_internal + 8),
             *(VkDeviceSize *)(HVar5.m_internal + 0x10),__n);
  TVar15 = ::vk::mapVkFormat(imageParms->format);
  bVar9 = tcu::hasDepthComponent(TVar15.order);
  bVar10 = tcu::hasStencilComponent(TVar15.order);
  iVar1 = (uint)bVar9 * 2 + (uint)bVar10 * 4;
  postImageBarrier.subresourceRange.aspectMask = iVar1 + (uint)(iVar1 == 0);
  imageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageBarrier.pNext = (void *)0x0;
  imageBarrier.srcAccessMask = 0x1000;
  imageBarrier.dstAccessMask = 0x800;
  imageBarrier.oldLayout = imageParms->operationLayout;
  imageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  imageBarrier.srcQueueFamilyIndex = 0xffffffff;
  imageBarrier.dstQueueFamilyIndex = 0xffffffff;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  imageBarrier.subresourceRange.baseArrayLayer = 0;
  postImageBarrier.subresourceRange.layerCount = 1;
  if (imageParms->imageType == VK_IMAGE_TYPE_2D) {
    postImageBarrier.subresourceRange.layerCount = (imageParms->extent).depth;
  }
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ = 0x2c;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x200000001000;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0xffffffffffffffff;
  local_188 = local_1d8.m_internal;
  local_180 = 0;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0x800;
  postImageBarrier.dstAccessMask = 0x1000;
  postImageBarrier.newLayout = imageBarrier.oldLayout;
  postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
  postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
  postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
  postImageBarrier.subresourceRange.baseMipLevel = 0;
  postImageBarrier.subresourceRange.levelCount = 1;
  postImageBarrier.subresourceRange.baseArrayLayer = 0;
  order = (((ConstPixelBufferAccess *)&local_1b0->order)->m_format).order;
  local_178 = __n;
  postImageBarrier.image.m_internal = image.m_internal;
  imageBarrier.image.m_internal = image.m_internal;
  imageBarrier.subresourceRange.aspectMask = postImageBarrier.subresourceRange.aspectMask;
  imageBarrier.subresourceRange.layerCount = postImageBarrier.subresourceRange.layerCount;
  bVar9 = tcu::hasDepthComponent(order);
  bVar10 = tcu::hasStencilComponent(order);
  format = local_1b0;
  size = local_1b0 + 1;
  local_a8 = (uint)bVar9 * 2 + (uint)bVar10 * 4;
  local_a8 = local_a8 + (uint)(local_a8 == 0);
  local_b8 = 0;
  local_b0 = *size;
  local_a4 = 0;
  local_9c = 1;
  if (imageParms->imageType == VK_IMAGE_TYPE_2D) {
    local_9c = (imageParms->extent).depth;
  }
  local_98 = 0;
  local_90 = 0;
  cmdBufferBeginInfo.flags = 1;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext._0_4_ = 0;
  cmdBufferBeginInfo.pNext._4_4_ = 0;
  local_8c = uVar4;
  local_84 = VVar12;
  VVar13 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar13,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x285);
  cmdBuffer = &this->m_cmdBuffer;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x1000,0,0,
             0,0,0,1,&imageBarrier);
  (*vk->_vptr_DeviceInterface[99])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,image.m_internal,6
             ,local_1d8.m_internal,1,&local_b8);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,0x5000,0,0,
             0,1,&local_1a8,1,&postImageBarrier);
  VVar13 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar13,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x289);
  submitCommandsAndWait(this,vk,device,queue,(VkCommandBuffer *)cmdBuffer);
  ::vk::invalidateMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(HVar5.m_internal + 8),
             *(VkDeviceSize *)(HVar5.m_internal + 0x10),__n);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_80,format,(IVec3 *)size,*(void **)(HVar5.m_internal + 0x18));
  tcu::copy((EVP_PKEY_CTX *)format,(EVP_PKEY_CTX *)&local_80);
  (**(code **)(*(long *)HVar5.m_internal + 8))(HVar5.m_internal);
  if (local_1d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1d0,local_1d8);
  }
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::readImageAspect (vk::VkImage					image,
													 const tcu::PixelBufferAccess&	dst,
													 const ImageParms&				imageParms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	Allocator&					allocator			= m_context.getDefaultAllocator();

	Move<VkBuffer>				buffer;
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const VkDeviceSize			pixelDataSize		= calculateSize(dst);
	const VkExtent3D			imageExtent			= getExtent3D(imageParms);

	// Create destination buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			pixelDataSize,								// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, device, &bufferParams);
		bufferAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, device, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(device, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

		deMemset(bufferAlloc->getHostPtr(), 0, static_cast<size_t>(pixelDataSize));
		flushMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	}

	// Barriers for copying image to buffer
	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(imageParms.format));
	const VkImageMemoryBarrier				imageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
		imageParms.operationLayout,					// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{											// VkImageSubresourceRange	subresourceRange;
			formatAspect,			// VkImageAspectFlags	aspectMask;
			0u,						// deUint32				baseMipLevel;
			1u,						// deUint32				mipLevels;
			0u,						// deUint32				baseArraySlice;
			getArraySize(imageParms)// deUint32				arraySize;
		}
	};

	const VkBufferMemoryBarrier				bufferBarrier			=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		pixelDataSize								// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			oldLayout;
		imageParms.operationLayout,					// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					dstQueueFamilyIndex;
		image,										// VkImage					image;
		{
			formatAspect,								// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			1u,											// deUint32				mipLevels;
			0u,											// deUint32				baseArraySlice;
			getArraySize(imageParms)					// deUint32				arraySize;
		}											// VkImageSubresourceRange	subresourceRange;
	};

	// Copy image to buffer
	const VkImageAspectFlags	aspect			= getAspectFlags(dst.getFormat());
	const VkBufferImageCopy		copyRegion		=
	{
		0u,									// VkDeviceSize				bufferOffset;
		(deUint32)dst.getWidth(),			// deUint32					bufferRowLength;
		(deUint32)dst.getHeight(),			// deUint32					bufferImageHeight;
		{
			aspect,								// VkImageAspectFlags		aspect;
			0u,									// deUint32					mipLevel;
			0u,									// deUint32					baseArrayLayer;
			getArraySize(imageParms),			// deUint32					layerCount;
		},									// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },						// VkOffset3D				imageOffset;
		imageExtent							// VkExtent3D				imageExtent;
	};

	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imageBarrier);
	vk.cmdCopyImageToBuffer(*m_cmdBuffer, image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *buffer, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT|VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &bufferBarrier, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, device, queue, *m_cmdBuffer);

	// Read buffer data
	invalidateMappedMemoryRange(vk, device, bufferAlloc->getMemory(), bufferAlloc->getOffset(), pixelDataSize);
	tcu::copy(dst, tcu::ConstPixelBufferAccess(dst.getFormat(), dst.getSize(), bufferAlloc->getHostPtr()));
}